

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O1

unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> __thiscall
mg::data::MappedMrg::parse(MappedMrg *this,string *hed,shared_ptr<mg::fs::MappedFile> *backing_data)

{
  ulong uVar1;
  pointer pcVar2;
  MappedMrg *this_00;
  ulong uVar3;
  PackedEntryHeader local_88;
  PackedEntryHeader header;
  long local_70;
  shared_ptr<mg::fs::MappedFile> local_58;
  undefined1 auStack_48 [8];
  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  entries;
  
  uVar1 = hed->_M_string_length;
  if ((uVar1 & 7) == 0) {
    pcVar2 = (hed->_M_dataplus)._M_p;
    auStack_48 = (undefined1  [8])0x0;
    entries.
    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entries.
    super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        local_88 = *(PackedEntryHeader *)(pcVar2 + uVar3 * 8);
        if (local_88.offset == 0xffffffff) break;
        std::
        vector<mg::data::Mrg::PackedEntryHeader,std::allocator<mg::data::Mrg::PackedEntryHeader>>::
        emplace_back<mg::data::Mrg::PackedEntryHeader&>
                  ((vector<mg::data::Mrg::PackedEntryHeader,std::allocator<mg::data::Mrg::PackedEntryHeader>>
                    *)auStack_48,&local_88);
        uVar3 = uVar3 + 1;
      } while (uVar1 >> 3 != uVar3);
    }
    this_00 = (MappedMrg *)operator_new(0x28);
    local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
    ::vector((vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
              *)&header,
             (vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
              *)auStack_48);
    MappedMrg(this_00,&local_58,
              (vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
               *)&header);
    (this->_backing_data).super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this_00;
    if (header != (PackedEntryHeader)0x0) {
      operator_delete((void *)header,local_70 - (long)header);
    }
    if (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)entries.
                            super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
  }
  else {
    parse(this);
  }
  return (__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>
         )(__uniq_ptr_data<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<MappedMrg>
MappedMrg::parse(const std::string &hed,
                 std::shared_ptr<mg::fs::MappedFile> backing_data) {
  // Check header size valid
  if (hed.size() % sizeof(Mrg::PackedEntryHeader) != 0) {
    fprintf(stderr, "Wrong size for HED, must be multiple of %lu\n",
            sizeof(Mrg::PackedEntryHeader));
    return nullptr;
  }

  // Reinterpret header
  const ssize_t entry_count = hed.size() / sizeof(Mrg::PackedEntryHeader);
  const Mrg::PackedEntryHeader *raw_entries =
      reinterpret_cast<const Mrg::PackedEntryHeader *>(hed.data());

  // Load entry table
  std::vector<Mrg::PackedEntryHeader> entries;
  for (ssize_t i = 0; i < entry_count; i++) {
    // Copy current header
    Mrg::PackedEntryHeader header = raw_entries[i];

    // Endian swap to host
    header.to_host_order();

    // Is this EOF?
    if (header.offset == 0xFFFF'FFFF) {
      break;
    }

    // Emplace into list
    entries.emplace_back(header);
  }

  return std::unique_ptr<MappedMrg>(new MappedMrg(backing_data, entries));
}